

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_addSwapVariables(DdManager *dd,DdNode *f,DdNode **x,DdNode **y,int n)

{
  DdHalfWord DVar1;
  DdHalfWord DVar2;
  int *permut_00;
  int *permut;
  int k;
  int j;
  int i;
  DdNode *swapped;
  int n_local;
  DdNode **y_local;
  DdNode **x_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  permut_00 = (int *)malloc((long)dd->size << 2);
  if (permut_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (k = 0; k < dd->size; k = k + 1) {
      permut_00[k] = k;
    }
    for (k = 0; k < n; k = k + 1) {
      DVar1 = x[k]->index;
      DVar2 = y[k]->index;
      permut_00[(int)DVar1] = DVar2;
      permut_00[(int)DVar2] = DVar1;
    }
    dd_local = (DdManager *)Cudd_addPermute(dd,f,permut_00);
    if (permut_00 != (int *)0x0) {
      free(permut_00);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addSwapVariables(
  DdManager * dd,
  DdNode * f,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *swapped;
    int  i, j, k;
    int  *permut;

    permut = ABC_ALLOC(int,dd->size);
    if (permut == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) permut[i] = i;
    for (i = 0; i < n; i++) {
        j = x[i]->index;
        k = y[i]->index;
        permut[j] = k;
        permut[k] = j;
    }

    swapped = Cudd_addPermute(dd,f,permut);
    ABC_FREE(permut);

    return(swapped);

}